

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_dump(lua_State *L)

{
  int iVar1;
  int iVar2;
  str_Writer state;
  undefined4 local_2040 [2];
  luaL_Buffer local_2038;
  
  iVar1 = lua_toboolean(L,2);
  iVar2 = 1;
  luaL_checktype(L,1,6);
  lua_settop(L,1);
  local_2040[0] = 0;
  iVar1 = lua_dump(L,writer,local_2040,iVar1);
  if (iVar1 == 0) {
    luaL_pushresult(&local_2038);
  }
  else {
    iVar2 = luaL_error(L,"unable to dump given function");
  }
  return iVar2;
}

Assistant:

static int str_dump (lua_State *L) {
  struct str_Writer state;
  int strip = lua_toboolean(L, 2);
  luaL_checktype(L, 1, LUA_TFUNCTION);
  lua_settop(L, 1);  /* ensure function is on the top of the stack */
  state.init = 0;
  if (lua_dump(L, writer, &state, strip) != 0)
    return luaL_error(L, "unable to dump given function");
  luaL_pushresult(&state.B);
  return 1;
}